

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_response.cc
# Opt level: O0

int __thiscall CreateResponse::Update(CreateResponse *this,ByteBuffer *buffer)

{
  element_type *peVar1;
  FileInfo *in_RSI;
  ByteBuffer *in_RDI;
  
  NamenodeResponse::Update((NamenodeResponse *)in_RSI,in_RDI);
  FileInfo::Update(in_RSI,in_RDI);
  FileInfo::Update(in_RSI,in_RDI);
  peVar1 = std::__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x163955);
  (*peVar1->_vptr_BlockInfo[2])(peVar1,in_RSI);
  peVar1 = std::__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<BlockInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x163973);
  (*peVar1->_vptr_BlockInfo[2])(peVar1,in_RSI);
  return 0;
}

Assistant:

int CreateResponse::Update(ByteBuffer &buffer) {
  NamenodeResponse::Update(buffer);

  file_info_.Update(buffer);
  parent_info_.Update(buffer);
  file_block_->Update(buffer);
  parent_block_->Update(buffer);

  return 0;
}